

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O0

int xSAT_SolverClaCalcLBD2(xSAT_Solver_t *s,Vec_Int_t *vLits)

{
  Vec_Int_t *p;
  int iVar1;
  uint uVar2;
  int local_20;
  int Level;
  int nLBD;
  int i;
  Vec_Int_t *vLits_local;
  xSAT_Solver_t *s_local;
  
  local_20 = 0;
  s->nStamp = s->nStamp + 1;
  Level = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vLits);
    if (iVar1 <= Level) break;
    p = s->vLevels;
    iVar1 = Vec_IntEntry(vLits,Level);
    iVar1 = xSAT_Lit2Var(iVar1);
    iVar1 = Vec_IntEntry(p,iVar1);
    uVar2 = Vec_IntEntry(s->vStamp,iVar1);
    if (uVar2 != s->nStamp) {
      Vec_IntWriteEntry(s->vStamp,iVar1,s->nStamp);
      local_20 = local_20 + 1;
    }
    Level = Level + 1;
  }
  return local_20;
}

Assistant:

static inline int xSAT_SolverClaCalcLBD2( xSAT_Solver_t * s, Vec_Int_t * vLits )
{
    int i;
    int nLBD = 0;

    s->nStamp++;
    for ( i = 0; i < Vec_IntSize( vLits ); i++ )
    {
        int Level = Vec_IntEntry( s->vLevels, xSAT_Lit2Var( Vec_IntEntry( vLits, i ) ) );
        if ( ( unsigned ) Vec_IntEntry( s->vStamp, Level ) != s->nStamp )
        {
            Vec_IntWriteEntry( s->vStamp, Level, ( int ) s->nStamp );
            nLBD++;
        }
    }
    return nLBD;
}